

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Cart_create(MPIABI_Comm comm_old,int ndims,int *dims,int *periods,int reorder,
                      MPIABI_Comm *comm_cart)

{
  int iVar1;
  
  iVar1 = MPI_Cart_create();
  return iVar1;
}

Assistant:

int MPIABI_Cart_create(
  MPIABI_Comm comm_old,
  int ndims,
  const int * dims,
  const int * periods,
  int reorder,
  MPIABI_Comm * comm_cart
) {
  return MPI_Cart_create(
    (MPI_Comm)(WPI_Comm)comm_old,
    ndims,
    dims,
    periods,
    reorder,
    (MPI_Comm *)(WPI_CommPtr)comm_cart
  );
}